

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int select_cipher(ptls_cipher_suite_t **selected,ptls_cipher_suite_t **candidates,uint8_t *src,
                 uint8_t *end,int server_preference)

{
  ushort uVar1;
  ulong uVar2;
  int iVar3;
  ptls_cipher_suite_t *ppVar4;
  ulong uVar5;
  size_t i;
  ulong uVar6;
  
  uVar2 = 0xffffffffffffffff;
  do {
    uVar5 = uVar2;
    if (src == end) {
      if (uVar5 == 0xffffffffffffffff) {
        iVar3 = 0x28;
      }
      else {
        ppVar4 = candidates[uVar5];
LAB_0010dabc:
        *selected = ppVar4;
        iVar3 = 0;
      }
      return iVar3;
    }
    if ((long)end - (long)src < 2) {
      return 0x32;
    }
    uVar1 = *(ushort *)src;
    src = (uint8_t *)((long)src + 2);
    for (uVar6 = 0; ppVar4 = candidates[uVar6], uVar2 = uVar5, ppVar4 != (ptls_cipher_suite_t *)0x0;
        uVar6 = uVar6 + 1) {
      if (ppVar4->id == (uint16_t)(uVar1 << 8 | uVar1 >> 8)) {
        if (server_preference == 0) goto LAB_0010dabc;
        uVar2 = uVar6;
        if (uVar6 < uVar5) break;
      }
    }
  } while( true );
}

Assistant:

static int select_cipher(ptls_cipher_suite_t **selected, ptls_cipher_suite_t **candidates, const uint8_t *src,
                         const uint8_t *const end, int server_preference)
{
    size_t found_index = SIZE_MAX;
    int ret;

    while (src != end) {
        uint16_t id;
        if ((ret = ptls_decode16(&id, &src, end)) != 0)
            goto Exit;
        for (size_t i = 0; candidates[i] != NULL; ++i) {
            if (candidates[i]->id == id) {
                if (server_preference) {
                    /* preserve smallest matching index, and proceed to the next input */
                    if (i < found_index) {
                        found_index = i;
                        break;
                    }
                } else {
                    /* return the pointer matching to the first input that can be used */
                    *selected = candidates[i];
                    goto Exit;
                }
            }
        }
    }
    if (found_index != SIZE_MAX) {
        *selected = candidates[found_index];
        ret = 0;
    } else {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
    }

Exit:
    return ret;
}